

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VelocityZ.cpp
# Opt level: O2

void __thiscall OpenMD::VelocityZ::process(VelocityZ *this)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  SimInfo *info;
  Snapshot *this_00;
  pointer pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  SelectionManager *this_01;
  ulong uVar10;
  double dVar11;
  StuntDouble *sd;
  int ii;
  Vector3d pos;
  Mat3x3d hmat;
  DumpReader reader;
  StuntDouble *local_1318;
  int local_1310;
  int local_130c;
  SelectionEvaluator *local_1308;
  vector<double,_std::allocator<double>_> *local_1300;
  ulong local_12f8;
  SelectionManager *local_12f0;
  SelectionSet local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_1310 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_1310 / (this->super_StaticAnalyser).step_;
  local_1300 = &this->zBox_;
  local_1308 = &this->evaluator_;
  this_01 = &this->seleMan_;
  uVar7 = 0;
  local_12f0 = this_01;
  while( true ) {
    if (local_1310 <= (int)uVar7) break;
    local_12f8 = uVar7;
    DumpReader::readFrame(&local_1288,(int)uVar7);
    this_00 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = this_00;
    uVar9 = this->nBins2_;
    uVar3 = (this->super_StaticAnalyser).nBins_;
    for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      pvVar4 = (this->sliceSDLists_).
               super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar8 = 0; (ulong)uVar3 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        lVar5 = *(long *)&pvVar4[uVar7].
                          super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        if (*(long *)(lVar5 + 8 + lVar8) != *(long *)(lVar5 + lVar8)) {
          *(long *)(lVar5 + 8 + lVar8) = *(long *)(lVar5 + lVar8);
        }
      }
    }
    Snapshot::getHmat(&local_12d0,this_00);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_1300,
               (value_type_conflict2 *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis2_ * 0x20));
    dVar11 = *(double *)
              ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
              + (ulong)(uint)this->axis1_ * 0x20);
    dVar1 = *(double *)
             ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
             + (ulong)(uint)this->axis2_ * 0x20);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12e8,local_1308);
      SelectionManager::setSelectionSet(this_01,&local_12e8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12e8.bitsets_);
    }
    local_1318 = SelectionManager::beginSelected(this_01,&local_130c);
    while (local_1318 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1318);
      if (cVar2 != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12e8);
      }
      StuntDouble::setPos(local_1318,(Vector3d *)&local_12e8);
      local_1318 = SelectionManager::nextSelected(this_01,&local_130c);
    }
    local_1318 = SelectionManager::beginSelected(this_01,&local_130c);
    while (local_1318 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1318);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 ((long)(int)((((double)(&local_12e8.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start)
                                        [(uint)this->axis1_] + dVar11 * 0.5) *
                              (double)(this->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12d0.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)this->axis1_ * 0x20)) * 0x18 +
                 *(long *)&(this->sliceSDLists_).
                           super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [(int)((((double)(&local_12e8.bitsets_.
                                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                              ._M_impl.super__Vector_impl_data._M_start)
                                            [(uint)this->axis2_] + dVar1 * 0.5) *
                                  (double)this->nBins2_) /
                                 *(double *)
                                  ((long)local_12d0.super_SquareMatrix<double,_3>.
                                         super_RectMatrix<double,_3U,_3U>.data_ +
                                  (ulong)(uint)this->axis2_ * 0x20))].
                           super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                           ._M_impl.super__Vector_impl_data),&local_1318);
      local_1318 = SelectionManager::nextSelected(this_01,&local_130c);
    }
    local_1318 = (value_type)0x0;
    for (uVar7 = 0; uVar7 < this->nBins2_; uVar7 = uVar7 + 1) {
      for (uVar10 = 0; uVar10 < (this->super_StaticAnalyser).nBins_; uVar10 = uVar10 + 1) {
        uVar9 = 0;
        dVar11 = 0.0;
        while( true ) {
          lVar8 = *(long *)&(this->sliceSDLists_).
                            super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          lVar5 = *(long *)(lVar8 + uVar10 * 0x18);
          lVar8 = *(long *)(lVar8 + 8 + uVar10 * 0x18);
          uVar6 = lVar8 - lVar5 >> 3;
          if (uVar6 <= uVar9) break;
          StuntDouble::getVel((Vector3d *)&local_12e8,*(StuntDouble **)(lVar5 + (ulong)uVar9 * 8));
          dVar11 = dVar11 + (double)(&local_12e8.bitsets_.
                                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                      ._M_impl.super__Vector_impl_data._M_start)[(uint)this->axis3_]
          ;
          uVar9 = uVar9 + 1;
        }
        if (lVar8 != lVar5) {
          lVar8 = *(long *)&(this->velocity_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar8 + uVar10 * 8) =
               dVar11 / (double)(long)uVar6 + *(double *)(lVar8 + uVar10 * 8);
        }
      }
      this_01 = local_12f0;
    }
    uVar7 = (ulong)(uint)((int)local_12f8 + (this->super_StaticAnalyser).step_);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void VelocityZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();

      zBox_.push_back(hmat(axis2_, axis2_));

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins2_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo2][binNo1].push_back(sd);
      }

      // loop over the slices to calculate the velocities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalVelocity = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalVelocity += sliceSDLists_[i][j][k]->getVel()[axis3_];
          }

          if (sliceSDLists_[i][j].size() > 0)
            velocity_[i][j] += totalVelocity / sliceSDLists_[i][j].size();
        }
      }
    }

    writeVelocity();
  }